

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O2

void uWS::Group<true>::timerCallback(uv_timer_t *timer)

{
  Group<true> *this;
  OpCode opCode;
  size_type length;
  pointer message;
  anon_class_1_0_00000001 local_9;
  
  this = (Group<true> *)timer->data;
  forEach<uWS::Group<true>::timerCallback(uv_timer_s*)::_lambda(uWS::WebSocket<true>)_1_>
            (this,&local_9);
  length = (this->userPingMessage)._M_string_length;
  if (length == 0) {
    opCode = PING;
    message = (char *)0x0;
    length = 0;
  }
  else {
    message = (this->userPingMessage)._M_dataplus._M_p;
    opCode = TEXT;
  }
  broadcast(this,message,length,opCode);
  return;
}

Assistant:

void Group<isServer>::timerCallback(uv_timer_t *timer) {
    Group<isServer> *group = (Group<isServer> *) timer->data;

    group->forEach([](uWS::WebSocket<isServer> ws) {
        typename uWS::WebSocket<isServer>::Data *webSocketData = (typename uWS::WebSocket<isServer>::Data *) ws.getSocketData();
        if (webSocketData->hasOutstandingPong) {
            ws.terminate();
        } else {
            webSocketData->hasOutstandingPong = true;
        }
    });

    if (group->userPingMessage.length()) {
        group->broadcast(group->userPingMessage.data(), group->userPingMessage.length(), OpCode::TEXT);
    } else {
        group->broadcast(nullptr, 0, OpCode::PING);
    }
}